

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O1

void __thiscall Table::init_file(Table *this)

{
  size_t in_RCX;
  Record r;
  fstream f;
  char *local_3b8 [2];
  char local_3a8 [392];
  string local_220 [16];
  
  get_filename_abi_cxx11_(local_220,this);
  remove(local_220[0]._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220[0]._M_dataplus._M_p != &local_220[0].field_2) {
    operator_delete(local_220[0]._M_dataplus._M_p);
  }
  std::fstream::fstream(local_220);
  get_filename_abi_cxx11_((string *)local_3b8,this);
  bin_io::open_fileW((fstream *)local_220,local_3b8[0]);
  if (local_3b8[0] != (char *)((long)((Record *)local_3b8)->buffer + 0xcU)) {
    operator_delete(local_3b8[0]);
  }
  Record::Record((Record *)local_3b8);
  Record::create_from_vector((Record *)local_3b8,&this->columns);
  Record::write((Record *)local_3b8,(int)local_220,(void *)0x0,in_RCX);
  std::fstream::close();
  std::fstream::~fstream(local_220);
  return;
}

Assistant:

void Table::init_file() {
    remove(get_filename().c_str());
    // write fields to a block
    std::fstream f;
    bin_io::open_fileW(f, get_filename().c_str());
    Record r;
    r.create_from_vector(columns);
    // write block to beginning of the file
    r.write(f, 0);
    f.close();
}